

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

void __thiscall
CoreML::Specification::LayerNormalizationLayerParams::_internal_add_normalizedshape
          (LayerNormalizationLayerParams *this,int64_t value)

{
  RepeatedField<long> *this_00;
  uint uVar1;
  long *plVar2;
  long tmp;
  
  this_00 = &this->normalizedshape_;
  uVar1 = (this->normalizedshape_).current_size_;
  if (uVar1 == (this->normalizedshape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(this_00,uVar1 + 1);
    plVar2 = google::protobuf::RepeatedField<long>::elements(this_00);
    plVar2[uVar1] = value;
  }
  else {
    plVar2 = google::protobuf::RepeatedField<long>::elements(this_00);
    plVar2[uVar1] = value;
  }
  this_00->current_size_ = uVar1 + 1;
  return;
}

Assistant:

inline void LayerNormalizationLayerParams::_internal_add_normalizedshape(int64_t value) {
  normalizedshape_.Add(value);
}